

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int get_mvpred_compound_var_cost
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV *this_mv,
              FULLPEL_MV_STATS *mv_stats)

{
  MV_COST_TYPE MVar1;
  short sVar2;
  short sVar3;
  int iVar4;
  aom_variance_fn_ptr_t *paVar5;
  buf_2d *pbVar6;
  buf_2d *pbVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  MV *pMVar11;
  short sVar12;
  short sVar13;
  uint uVar14;
  int iVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  
  paVar5 = ms_params->vfp;
  pbVar6 = (ms_params->ms_buffers).ref;
  pbVar7 = (ms_params->ms_buffers).src;
  puVar8 = pbVar7->buf;
  iVar15 = pbVar7->stride;
  iVar4 = pbVar6->stride;
  puVar9 = (ms_params->ms_buffers).mask;
  puVar10 = (ms_params->ms_buffers).second_pred;
  if (puVar9 == (uint8_t *)0x0) {
    if (puVar10 == (uint8_t *)0x0) {
      uVar14 = (*paVar5->vf)(puVar8,iVar15,
                             pbVar6->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar4,
                             iVar4,&mv_stats->sse);
    }
    else {
      uVar14 = (*paVar5->svaf)(pbVar6->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar4,
                               iVar4,0,0,puVar8,iVar15,&mv_stats->sse,puVar10);
    }
  }
  else {
    uVar14 = (*paVar5->msvf)(pbVar6->buf + (long)this_mv->col + (long)this_mv->row * (long)iVar4,
                             iVar4,0,0,puVar8,iVar15,puVar10,puVar9,
                             (ms_params->ms_buffers).mask_stride,(ms_params->ms_buffers).inv_mask,
                             &mv_stats->sse);
  }
  mv_stats->distortion = uVar14;
  MVar1 = (ms_params->mv_cost_params).mv_cost_type;
  iVar15 = 0;
  if (MVar1 != '\x04') {
    sVar12 = this_mv->row * 8;
    sVar13 = this_mv->col * 8;
    pMVar11 = (ms_params->mv_cost_params).ref_mv;
    sVar2 = pMVar11->row;
    sVar16 = sVar12 - sVar2;
    sVar3 = pMVar11->col;
    sVar18 = sVar13 - sVar3;
    sVar17 = -sVar16;
    if (0 < sVar16) {
      sVar17 = sVar16;
    }
    sVar19 = -sVar18;
    if (0 < sVar18) {
      sVar19 = sVar18;
    }
    if (MVar1 == '\x03') {
      iVar15 = (int)sVar19 + (int)sVar17 >> 3;
    }
    else if (MVar1 == '\x01') {
      iVar15 = (int)sVar19 + (int)sVar17 >> 2;
    }
    else if (MVar1 == '\0') {
      iVar15 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar18] +
                      (long)(ms_params->mv_cost_params).mvcost[0][sVar16] +
                     (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                   (ulong)((uint)(sVar13 != sVar3) * 4 + (uint)(sVar12 != sVar2) * 8
                                          ))) * (long)(ms_params->mv_cost_params).error_per_bit +
                     0x2000U >> 0xe);
    }
  }
  mv_stats->err_cost = iVar15;
  return uVar14 + iVar15;
}

Assistant:

static inline int get_mvpred_compound_var_cost(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, const FULLPEL_MV *this_mv,
    FULLPEL_MV_STATS *mv_stats) {
  const aom_variance_fn_ptr_t *vfp = ms_params->vfp;
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  const int ref_stride = ref->stride;

  const uint8_t *mask = ms_params->ms_buffers.mask;
  const uint8_t *second_pred = ms_params->ms_buffers.second_pred;
  const int mask_stride = ms_params->ms_buffers.mask_stride;
  const int invert_mask = ms_params->ms_buffers.inv_mask;
  int bestsme;

  if (mask) {
    bestsme = vfp->msvf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, second_pred, mask, mask_stride,
                        invert_mask, &mv_stats->sse);
  } else if (second_pred) {
    bestsme = vfp->svaf(get_buf_from_fullmv(ref, this_mv), ref_stride, 0, 0,
                        src_buf, src_stride, &mv_stats->sse, second_pred);
  } else {
    bestsme = vfp->vf(src_buf, src_stride, get_buf_from_fullmv(ref, this_mv),
                      ref_stride, &mv_stats->sse);
  }
  mv_stats->distortion = bestsme;

  const MV sub_this_mv = get_mv_from_fullmv(this_mv);
  mv_stats->err_cost = mv_err_cost_(&sub_this_mv, &ms_params->mv_cost_params);
  bestsme += mv_stats->err_cost;

  return bestsme;
}